

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

vec2 vec2_reflect(vec2 u,vec2 v)

{
  vec2 vVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float len_sqrd_v;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar4 = v.x;
  fVar5 = v.y;
  fVar2 = u.x;
  fVar3 = u.y;
  fVar6 = fVar4 * fVar4 + fVar5 * fVar5;
  fVar9 = 0.0;
  fVar10 = 0.0;
  fVar7 = 0.0;
  fVar8 = 0.0;
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    fVar8 = (fVar2 * fVar4 + fVar5 * fVar3) / fVar6;
    fVar7 = fVar4 * fVar8;
    fVar8 = fVar8 * fVar5;
  }
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    fVar6 = (fVar2 * fVar4 + fVar3 * fVar5) / fVar6;
    fVar9 = fVar4 * fVar6;
    fVar10 = fVar6 * fVar5;
  }
  vVar1.y = (fVar3 - fVar8) - fVar10;
  vVar1.x = (fVar2 - fVar7) - fVar9;
  return vVar1;
}

Assistant:

vec2 vec2_reflect(vec2 u, vec2 v) {
    return vec2_sub(vec2_perpindicular_component(u, v), vec2_parallel_component(u, v));
}